

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O2

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray
          (Cdr *this,int32_t *long_t,size_t numElements,Endianness endianness)

{
  bool bVar1;
  
  bVar1 = this->m_swapBytes;
  this->m_swapBytes = (bool)(this->m_endianness != endianness ^ bVar1);
  deserializeArray(this,long_t,numElements);
  this->m_swapBytes = bVar1;
  return this;
}

Assistant:

Cdr& Cdr::deserializeArray(int32_t *long_t, size_t numElements, Endianness endianness)
{
    bool auxSwap = m_swapBytes;
    m_swapBytes = (m_swapBytes && (m_endianness == endianness)) || (!m_swapBytes && (m_endianness != endianness));

    try
    {
        deserializeArray(long_t, numElements);
        m_swapBytes = auxSwap;
    }
    catch(Exception &ex)
    {
        m_swapBytes = auxSwap;
        ex.raise();
    }

    return *this;
}